

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O3

void __thiscall
QPDF::validateStreamLineEnd(QPDF *this,QPDFObjectHandle *object,QPDFObjGen og,qpdf_offset_t offset)

{
  long *plVar1;
  long lVar2;
  qpdf_offset_t qVar3;
  char ch;
  byte local_d1;
  string local_d0;
  QPDFExc local_b0;
  
  plVar1 = *(long **)&(((this->m)._M_t.
                        super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                        .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                      super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>;
  lVar2 = (**(code **)(*plVar1 + 0x38))(plVar1,&local_d1,1);
  if (lVar2 != 0) {
    do {
      switch(local_d1) {
      case 9:
      case 0xb:
      case 0xc:
        goto switchD_0022e325_caseD_9;
      case 10:
        goto switchD_0022e325_caseD_a;
      case 0xd:
        plVar1 = *(long **)&(((this->m)._M_t.
                              super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                              .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                            super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>;
        lVar2 = (**(code **)(*plVar1 + 0x38))(plVar1,&local_d1,1);
        if ((lVar2 != 0) && (local_d1 != 10)) {
          plVar1 = *(long **)&(((this->m)._M_t.
                                super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                              super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>;
          (**(code **)(*plVar1 + 0x40))(plVar1,(int)(char)local_d1);
          qVar3 = (**(code **)(**(long **)&(((this->m)._M_t.
                                             super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                             .super__Head_base<0UL,_QPDF::Members_*,_false>.
                                            _M_head_impl)->file).
                                           super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>
                              + 0x20))();
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_d0,"stream keyword followed by carriage return only","");
          damagedPDF(&local_b0,this,qVar3,&local_d0);
          warn(this,&local_b0);
LAB_0022e4da:
          QPDFExc::~QPDFExc(&local_b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          }
        }
        goto switchD_0022e325_caseD_a;
      }
      if (local_d1 != 0x20) {
        plVar1 = *(long **)&(((this->m)._M_t.
                              super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                              .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                            super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>;
        (**(code **)(*plVar1 + 0x40))(plVar1,(int)(char)local_d1);
        qVar3 = (**(code **)(**(long **)&(((this->m)._M_t.
                                           super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                           .super__Head_base<0UL,_QPDF::Members_*,_false>.
                                          _M_head_impl)->file).
                                         super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>
                            + 0x20))();
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d0,"stream keyword not followed by proper line terminator","");
        damagedPDF(&local_b0,this,qVar3,&local_d0);
        warn(this,&local_b0);
        goto LAB_0022e4da;
      }
switchD_0022e325_caseD_9:
      qVar3 = (**(code **)(**(long **)&(((this->m)._M_t.
                                         super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                         .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl
                                        )->file).
                                       super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2> +
                          0x20))();
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d0,"stream keyword followed by extraneous whitespace","");
      damagedPDF(&local_b0,this,qVar3,&local_d0);
      warn(this,&local_b0);
      QPDFExc::~QPDFExc(&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      plVar1 = *(long **)&(((this->m)._M_t.
                            super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                            .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                          super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>;
      lVar2 = (**(code **)(*plVar1 + 0x38))(plVar1,&local_d1,1);
    } while (lVar2 != 0);
  }
switchD_0022e325_caseD_a:
  return;
}

Assistant:

void
QPDF::validateStreamLineEnd(QPDFObjectHandle& object, QPDFObjGen og, qpdf_offset_t offset)
{
    // The PDF specification states that the word "stream" should be followed by either a carriage
    // return and a newline or by a newline alone.  It specifically disallowed following it by a
    // carriage return alone since, in that case, there would be no way to tell whether the NL in a
    // CR NL sequence was part of the stream data.  However, some readers, including Adobe reader,
    // accept a carriage return by itself when followed by a non-newline character, so that's what
    // we do here. We have also seen files that have extraneous whitespace between the stream
    // keyword and the newline.
    while (true) {
        char ch;
        if (m->file->read(&ch, 1) == 0) {
            // A premature EOF here will result in some other problem that will get reported at
            // another time.
            return;
        }
        if (ch == '\n') {
            // ready to read stream data
            QTC::TC("qpdf", "QPDF stream with NL only");
            return;
        }
        if (ch == '\r') {
            // Read another character
            if (m->file->read(&ch, 1) != 0) {
                if (ch == '\n') {
                    // Ready to read stream data
                    QTC::TC("qpdf", "QPDF stream with CRNL");
                } else {
                    // Treat the \r by itself as the whitespace after endstream and start reading
                    // stream data in spite of not having seen a newline.
                    QTC::TC("qpdf", "QPDF stream with CR only");
                    m->file->unreadCh(ch);
                    warn(damagedPDF(
                        m->file->tell(), "stream keyword followed by carriage return only"));
                }
            }
            return;
        }
        if (!util::is_space(ch)) {
            QTC::TC("qpdf", "QPDF stream without newline");
            m->file->unreadCh(ch);
            warn(damagedPDF(
                m->file->tell(), "stream keyword not followed by proper line terminator"));
            return;
        }
        warn(damagedPDF(m->file->tell(), "stream keyword followed by extraneous whitespace"));
    }
}